

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# memory_tree.cc
# Opt level: O0

void memory_tree_ns::diag_kronecker_product_test(example *ec1,example *ec2,example *ec,int oas)

{
  byte bVar1;
  uchar *puVar2;
  uchar **ppuVar3;
  size_t sVar4;
  size_t sVar5;
  byte *pbVar6;
  long in_RDX;
  v_array<unsigned_char> *in_RSI;
  v_array<unsigned_char> *in_RDI;
  bool bVar7;
  features *unaff_retaddr;
  features *in_stack_00000008;
  features *in_stack_00000010;
  namespace_index c2;
  namespace_index c1;
  size_t idx2;
  size_t idx1;
  example *in_stack_ffffffffffffff98;
  example *in_stack_ffffffffffffffa0;
  example *in_stack_ffffffffffffffa8;
  undefined7 in_stack_ffffffffffffffb0;
  undefined1 in_stack_ffffffffffffffb7;
  size_t local_30;
  size_t local_28;
  
  VW::dealloc_example((_func_void_void_ptr *)
                      CONCAT17(in_stack_ffffffffffffffb7,in_stack_ffffffffffffffb0),
                      in_stack_ffffffffffffffa8,(_func_void_void_ptr *)in_stack_ffffffffffffffa0);
  copy_example_data(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,0);
  *(undefined4 *)(in_RDX + 0x68b4) = 0;
  ppuVar3 = v_array<unsigned_char>::begin(in_RDI);
  puVar2 = *ppuVar3;
  sVar4 = v_array<unsigned_char>::size(in_RDI);
  qsort(puVar2,sVar4,1,cmpfunc);
  ppuVar3 = v_array<unsigned_char>::begin(in_RSI);
  puVar2 = *ppuVar3;
  sVar4 = v_array<unsigned_char>::size(in_RSI);
  qsort(puVar2,sVar4,1,cmpfunc);
  local_28 = 0;
  local_30 = 0;
  while( true ) {
    sVar4 = local_28;
    sVar5 = v_array<unsigned_char>::size(in_RDI);
    bVar7 = false;
    if (sVar4 < sVar5) {
      sVar4 = local_30;
      sVar5 = v_array<unsigned_char>::size(in_RSI);
      bVar7 = sVar4 < sVar5;
    }
    if (!bVar7) break;
    pbVar6 = v_array<unsigned_char>::operator[](in_RDI,local_28);
    bVar1 = *pbVar6;
    pbVar6 = v_array<unsigned_char>::operator[](in_RSI,local_30);
    if (bVar1 < *pbVar6) {
      local_28 = local_28 + 1;
    }
    else {
      if (bVar1 <= *pbVar6) {
        diag_kronecker_prod_fs_test
                  (in_stack_00000010,in_stack_00000008,unaff_retaddr,(float *)in_RDI,
                   (float)((ulong)in_RSI >> 0x20),SUB84(in_RSI,0));
        local_28 = local_28 + 1;
      }
      local_30 = local_30 + 1;
    }
  }
  return;
}

Assistant:

void diag_kronecker_product_test(example& ec1, example& ec2, example& ec, int oas = false)
    {
        //copy_example_data(&ec, &ec1, oas); //no_feat false, oas: true
        VW::dealloc_example(nullptr, ec, nullptr); //clear ec
        copy_example_data(&ec, &ec1, oas);

        ec.total_sum_feat_sq = 0.0;  //sort namespaces.  pass indices array into sort...template (leave this to the end)
        
        qsort(ec1.indices.begin(), ec1.indices.size(), sizeof(namespace_index), cmpfunc);
        qsort(ec2.indices.begin(), ec2.indices.size(), sizeof(namespace_index), cmpfunc);
        
        size_t idx1 = 0;
        size_t idx2 = 0;
        while (idx1 < ec1.indices.size() && idx2 < ec2.indices.size())
        //for (size_t idx1 = 0, idx2 = 0; idx1 < ec1.indices.size() && idx2 < ec2.indices.size(); idx1++)
        {
            namespace_index c1 = ec1.indices[idx1];
            namespace_index c2 = ec2.indices[idx2];
            if (c1 < c2)
                idx1++;
            else if (c1 > c2)
                idx2++;
            else{
                diag_kronecker_prod_fs_test(ec1.feature_space[c1], ec2.feature_space[c2], ec.feature_space[c1], ec.total_sum_feat_sq, ec1.total_sum_feat_sq, ec2.total_sum_feat_sq);
                idx1++;
                idx2++;
            }
        }
    }